

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O3

void __thiscall TimerHeap::TimerHeap(TimerHeap *this,EventLoop *loop)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  EventLoop *this_00;
  EventLoop *pEVar2;
  long lVar3;
  element_type *peVar4;
  int iVar5;
  Channel *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  long local_40;
  ChannelPtr channel;
  
  iVar5 = timerfd_create(1,0x80800);
  this->timerfd_ = iVar5;
  this->loop_ = loop;
  (this->timerMap_)._M_h._M_buckets = &(this->timerMap_)._M_h._M_single_bucket;
  (this->timerMap_)._M_h._M_bucket_count = 1;
  (this->timerMap_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->timerMap_)._M_h._M_element_count = 0;
  (this->timerMap_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->timerMap_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->timerMap_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->timerHeap_).
  super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->timerHeap_).
  super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->timerHeap_).
  super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (iVar5 != -1) {
    bzero(&this->howlong_,0x20);
    this_01 = (Channel *)operator_new(0xa8);
    Channel::Channel(this_01,this->loop_,this->timerfd_);
    std::__shared_ptr<Channel,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Channel,void>
              ((__shared_ptr<Channel,(__gnu_cxx::_Lock_policy)2> *)&local_40,this_01);
    lVar3 = local_40;
    *(undefined4 *)(local_40 + 0x1c) = 0x80000001;
    local_78 = (code *)0x0;
    pcStack_70 = (code *)0x0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_88._M_unused._M_object = operator_new(0x18);
    *(code **)local_88._M_unused._0_8_ = handleTimeout;
    *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = 0;
    *(TimerHeap **)((long)local_88._M_unused._0_8_ + 0x10) = this;
    pcStack_70 = std::_Function_handler<void_(),_std::_Bind<void_(TimerHeap::*(TimerHeap_*))()>_>::
                 _M_invoke;
    local_78 = std::_Function_handler<void_(),_std::_Bind<void_(TimerHeap::*(TimerHeap_*))()>_>::
               _M_manager;
    std::function<void_()>::operator=
              ((function<void_()> *)(lVar3 + 0x28),(function<void_()> *)&local_88);
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    peVar4 = channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = this->loop_;
    if (channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &((channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<Channel>)._M_weak_this.
                  super___weak_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        UNLOCK();
      }
      else {
        p_Var1 = &((channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<Channel>)._M_weak_this.
                  super___weak_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      }
    }
    pEVar2 = this->loop_;
    local_58 = (code *)0x0;
    pcStack_50 = (code *)0x0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_68._M_unused._M_object = operator_new(0x28);
    *(code **)local_68._M_unused._0_8_ = EventLoop::addChannel;
    *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = 0;
    *(long *)((long)local_68._M_unused._0_8_ + 0x10) = local_40;
    *(element_type **)((long)local_68._M_unused._0_8_ + 0x18) = peVar4;
    *(EventLoop **)((long)local_68._M_unused._0_8_ + 0x20) = pEVar2;
    pcStack_50 = std::
                 _Function_handler<void_(),_std::_Bind<void_(EventLoop::*(EventLoop_*,_std::shared_ptr<Channel>))(std::shared_ptr<Channel>)>_>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(),_std::_Bind<void_(EventLoop::*(EventLoop_*,_std::shared_ptr<Channel>))(std::shared_ptr<Channel>)>_>
               ::_M_manager;
    EventLoop::runInLoop(this_00,(Functor *)&local_68);
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    if (channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return;
  }
  __assert_fail("timerfd_ != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/Timer.cpp"
                ,0x14,"TimerHeap::TimerHeap(EventLoop *)");
}

Assistant:

TimerHeap::TimerHeap(EventLoop* loop) 
    : timerfd_(timerfd_create(CLOCK_MONOTONIC, TFD_NONBLOCK | TFD_CLOEXEC)),
      loop_(loop) {
    assert(timerfd_ != -1);
    bzero(&howlong_, sizeof howlong_);
    ChannelPtr channel(new Channel(loop_, timerfd_));
    channel->setEvent(EPOLLIN | EPOLLET);
    channel->setReadCallback(std::bind(&TimerHeap::handleTimeout, this));
    loop_->runInLoop(std::bind(&EventLoop::addChannel, loop_, channel));
}